

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O3

double __thiscall
Trainer::Trainer<Kuhn::Game>::CFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint actionNum;
  int iVar4;
  mapped_type *ppNVar5;
  mapped_type this_00;
  double *pdVar6;
  iterator iVar7;
  undefined8 uVar8;
  uint action;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dStack_110;
  double dStack_108;
  undefined1 local_100 [8];
  Game game_cp;
  string infoSet;
  void *local_50;
  double local_38;
  
  uVar8 = &dStack_108;
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  dStack_110 = 5.56436987037891e-318;
  bVar3 = Kuhn::Game::done(game);
  if (bVar3) {
    dVar11 = Kuhn::Game::payoff(game,playerIndex);
    return dVar11;
  }
  dStack_110 = 5.56454773401142e-318;
  actionNum = Kuhn::Game::actionNum(game);
  dStack_110 = 5.56460208123246e-318;
  bVar3 = Kuhn::Game::isChanceNode(game);
  if (bVar3) {
    if (0 < (int)actionNum) {
      action = 0;
      dVar11 = 0.0;
      do {
        dStack_110 = 5.56486393602475e-318;
        Kuhn::Game::Game((Game *)local_100,game);
        dStack_110 = 5.5649182832458e-318;
        Kuhn::Game::step((Game *)local_100,action);
        dStack_110 = 5.56495780849746e-318;
        dVar12 = Kuhn::Game::chanceProbability((Game *)local_100);
        dStack_110 = 5.56512085016059e-318;
        dVar13 = CFR(this,(Game *)local_100,playerIndex,pi,dVar12 * po);
        dVar11 = dVar11 + dVar13 * dVar12;
        action = action + 1;
      } while (actionNum != action);
      return dVar11;
    }
    return 0.0;
  }
  dStack_110 = 5.56537776429643e-318;
  Kuhn::Game::infoSetStr_abi_cxx11_((string *)(game_cp.mInfoSets[1] + 9),game);
  dStack_110 = 5.5654172895481e-318;
  iVar4 = Kuhn::Game::currentPlayer(game);
  if (this->mUpdate[iVar4] == false) {
    if ((int)actionNum < 1) {
      local_38 = 0.0;
      uVar8 = &dStack_108;
      uVar2 = infoSet.field_2._8_8_;
    }
    else {
      local_38 = 0.0;
      uVar10 = 0;
      do {
        dStack_110 = 5.56766034758022e-318;
        Kuhn::Game::Game((Game *)local_100,game);
        dStack_110 = 5.56771469480126e-318;
        Kuhn::Game::step((Game *)local_100,(int)uVar10);
        dStack_110 = 5.5678283298998e-318;
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this->mFixedStrategies[iVar4]._M_h,(key_type *)(game_cp.mInfoSets[1] + 9));
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          dStack_110 = 5.56887080841253e-318;
          uVar8 = std::__throw_out_of_range("_Map_base::at");
          dStack_110 = 5.56895479957232e-318;
          operator_delete(local_50,0x30);
          if ((size_type *)game_cp._88_8_ != &infoSet._M_string_length) {
            dStack_110 = 5.56921171370816e-318;
            operator_delete((void *)game_cp._88_8_,infoSet._M_string_length + 1);
          }
          dStack_110 = 5.56925123895983e-318;
          _Unwind_Resume(uVar8);
        }
        dStack_110 = 5.56791726171605e-318;
        pdVar6 = Node::averageStrategy
                           (*(Node **)((long)iVar7.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                             ._M_cur + 0x28));
        dVar11 = pdVar6[uVar10];
        dStack_110 = 5.56808524403564e-318;
        dVar12 = CFR(this,(Game *)local_100,playerIndex,pi,dVar11 * po);
        local_38 = local_38 + dVar11 * dVar12;
        uVar10 = uVar10 + 1;
        uVar8 = &dStack_108;
        uVar2 = infoSet.field_2._8_8_;
      } while (actionNum != uVar10);
    }
  }
  else {
    dStack_110 = 5.56563961908873e-318;
    ppNVar5 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
    this_00 = *ppNVar5;
    if (this_00 == (mapped_type)0x0) {
      dStack_110 = 5.56572855090498e-318;
      this_00 = (mapped_type)operator_new(0x30);
      dStack_110 = 5.56580266075185e-318;
      Node::Node(this_00,actionNum);
      dStack_110 = 5.56588171125519e-318;
      ppNVar5 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mNodeMap,(key_type *)(game_cp.mInfoSets[1] + 9));
      *ppNVar5 = this_00;
    }
    dStack_110 = 5.56595582110206e-318;
    pdVar6 = Node::strategy(this_00);
    uVar10 = (ulong)actionNum;
    lVar1 = -(uVar10 * 8 + 0xf & 0xfffffffffffffff0);
    if ((int)actionNum < 1) {
      local_38 = 0.0;
      infoSet.field_2._8_8_ = &dStack_108;
      uVar2 = &dStack_108;
      if (iVar4 != playerIndex) goto LAB_001132b1;
    }
    else {
      local_38 = 0.0;
      uVar9 = 0;
      infoSet.field_2._8_8_ = &dStack_108;
      do {
        *(undefined8 *)((long)&dStack_110 + lVar1) = 0x1130f9;
        Kuhn::Game::Game((Game *)local_100,game);
        *(undefined8 *)((long)&dStack_110 + lVar1) = 0x113104;
        Kuhn::Game::step((Game *)local_100,(int)uVar9);
        if (iVar4 == playerIndex) {
          dVar11 = pdVar6[uVar9] * pi;
          dVar12 = po;
        }
        else {
          dVar11 = pi;
          dVar12 = pdVar6[uVar9] * po;
        }
        *(undefined8 *)((long)&dStack_110 + lVar1) = 0x11313a;
        dVar11 = CFR(this,(Game *)local_100,playerIndex,dVar11,dVar12);
        *(double *)(local_100 + uVar9 * 8 + lVar1 + -0x108 + 0x100) = dVar11;
        local_38 = local_38 + dVar11 * pdVar6[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      uVar8 = infoSet.field_2._8_8_;
      uVar2 = infoSet.field_2._8_8_;
      if (iVar4 != playerIndex) goto LAB_001132b1;
      if (0 < (int)actionNum) {
        uVar9 = 0;
        do {
          dVar11 = *(double *)(local_100 + uVar9 * 8 + lVar1 + -0x108 + 0x100);
          *(undefined8 *)((long)&dStack_110 + lVar1) = 0x113196;
          dVar12 = Node::regretSum(this_00,(int)uVar9);
          *(undefined8 *)((long)&dStack_110 + lVar1) = 0x1131b7;
          Node::regretSum(this_00,(int)uVar9,(dVar11 - local_38) * po + dVar12);
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
    }
    *(undefined8 *)((long)&dStack_110 + lVar1) = 0x1132ad;
    Node::strategySum(this_00,pdVar6,pi);
    uVar8 = infoSet.field_2._8_8_;
    uVar2 = infoSet.field_2._8_8_;
  }
LAB_001132b1:
  infoSet.field_2._8_8_ = uVar2;
  if ((size_type *)game_cp._88_8_ != &infoSet._M_string_length) {
    *(undefined8 *)(uVar8 + 0xfffffffffffffff8) = 0x1132d0;
    operator_delete((void *)game_cp._88_8_,infoSet._M_string_length + 1);
  }
  return local_38;
}

Assistant:

double Trainer<T>::CFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // chance node turn
    const int actionNum = game.actionNum();
    if (game.isChanceNode()) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const double chanceProbability = game_cp.chanceProbability();
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const auto chanceProbability = double(mFixedStrategies[player].at(infoSet)->averageStrategy()[a]);
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call CFR with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = CFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = CFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}